

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool sx_strnequalnocase(char *a,char *b,int num)

{
  bool bVar1;
  int var__b_1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int var__b;
  int var__a;
  
  uVar2 = sx_strlen(a);
  uVar3 = sx_strlen(b);
  if (num <= (int)uVar2) {
    uVar2 = num;
  }
  if ((int)uVar3 < num) {
    num = uVar3;
  }
  if (uVar2 == num) {
    if ((int)uVar2 < 1) {
      bVar1 = true;
    }
    else {
      uVar4 = 0;
      do {
        if ((char)(((byte)(a[uVar4] + 0xbfU) < 0x1a) * ' ' + a[uVar4]) !=
            (char)(((byte)(b[uVar4] + 0xbfU) < 0x1a) * ' ' + b[uVar4])) goto LAB_00107f1c;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      bVar1 = uVar2 <= uVar4;
    }
  }
  else {
LAB_00107f1c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool sx_strnequalnocase(const char* SX_RESTRICT a, const char* SX_RESTRICT b, int num)
{
    int _alen = sx_strlen(a);
    int _blen = sx_strlen(b);
    int alen = sx_min(num, _alen);
    int blen = sx_min(num, _blen);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (sx_tolowerchar(a[i]) != sx_tolowerchar(b[i]))
            return false;
    }
    return true;
}